

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::setParent_sys(QWidgetPrivate *this,QWidget *newparent,WindowFlags f)

{
  uint uVar1;
  uint uVar2;
  QWidget *parent;
  long lVar3;
  QWExtra *pQVar4;
  QWidgetPrivate *this_00;
  QWidgetData *pQVar5;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var6;
  int *piVar7;
  QDebug QVar8;
  byte bVar9;
  QWidgetPrivate *d_3;
  QScreen *pQVar10;
  QWidget *this_01;
  QWidget *pQVar11;
  undefined8 uVar12;
  long lVar13;
  QWindow *pQVar14;
  long lVar15;
  long in_FS_OFFSET;
  bool bVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QFlagsStorage<Qt::WindowType> local_54;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&this->field_0x8;
  uVar1 = (this->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  uVar2 = *(uint *)(*(long *)&parent->field_0x8 + 0x240);
  local_54.i = (Int)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                    super_QFlagsStorage<Qt::WindowType>.i;
  if (newparent == (QWidget *)0x0) {
    pQVar10 = (QScreen *)0x0;
  }
  else {
    if ((char)(newparent->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i != '\x11') {
      pQVar10 = (QScreen *)0x0;
      goto LAB_0030db1a;
    }
    pQVar10 = QWidget::screen(newparent);
  }
  newparent = (QWidget *)0x0;
LAB_0030db1a:
  setWinId(this,0);
  if ((newparent == (QWidget *)0x0) &&
     (local_54.i = (uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                         super_QFlagsStorage<Qt::WindowType>.i | 1, *(long *)&this->field_0x10 != 0)
     ) {
    pQVar11 = *(QWidget **)(*(long *)&parent->field_0x8 + 0x10);
    do {
      this_01 = pQVar11;
      pQVar11 = *(QWidget **)(*(long *)&this_01->field_0x8 + 0x10);
      if (pQVar11 == (QWidget *)0x0) break;
    } while (((this_01->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
    pQVar10 = QWidget::screen(this_01);
  }
  bVar16 = false;
  if ((((uVar1 & 1) != 0) && (bVar16 = false, (uVar2 >> 0x1c & 1) != 0)) && ((local_54.i & 1) == 0))
  {
    bVar16 = (*(byte *)(*(long *)&parent->field_0x8 + 0x248) & 0x10) == 0;
  }
  if (*(QWidget **)&this->field_0x10 != newparent) {
    QObjectPrivate::setParent_helper((QObject *)this);
    lVar3 = *(long *)(*(long *)&parent->field_0x8 + 0x78);
    if (lVar3 == 0) {
      lVar13 = 0;
    }
    else {
      lVar13 = *(long *)(lVar3 + 8);
    }
    if ((lVar13 != 0) && (*(long *)(lVar13 + 0x20) != 0)) {
      QWindow::setFlags(*(undefined8 *)(*(long *)(lVar3 + 8) + 0x20),local_54.i);
    }
    pQVar11 = closestParentWidgetWithWindowHandle(this);
    if (bVar16) {
      reparentWidgetWindowChildren(this,pQVar11);
    }
    else {
      reparentWidgetWindows(this,pQVar11,(WindowFlags)local_54.i);
    }
  }
  if ((*(byte *)(*(long *)(*(long *)&this->field_0x8 + 0x20) + 10) & 1) == 0) {
    bVar9 = 0;
  }
  else {
    bVar9 = (*(byte *)(*(long *)(*(long *)&this->field_0x8 + 8) + 0x244) & 0x20) >> 5;
  }
  if (bVar16) {
    pQVar4 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar4 != (QWExtra *)0x0) && ((pQVar4->field_0x7d & 1) != 0)) {
      QWindowContainer::toplevelAboutToBeDestroyed(parent);
    }
    lVar3 = *(long *)(*(long *)&parent->field_0x8 + 0x78);
    if (*(long *)(*(long *)(*(long *)(*(long *)(lVar3 + 8) + 0x20) + 8) + 0x28) != 0) {
      closestParentWidgetWithWindowHandle(this);
      lVar3 = *(long *)(*(long *)(*(long *)(lVar3 + 8) + 0x20) + 8);
      lVar13 = *(long *)(lVar3 + 0x28);
      if (lVar13 != 0) {
        lVar3 = *(long *)(lVar3 + 0x20);
        lVar15 = 0;
        do {
          pQVar14 = *(QWindow **)(lVar3 + lVar15);
          if ((pQVar14 == (QWindow *)0x0) ||
             ((*(byte *)(*(long *)(pQVar14 + 8) + 0x30) & 0x40) == 0)) {
            pQVar14 = (QWindow *)0x0;
          }
          if (pQVar14 != (QWindow *)0x0) {
            lcWidgetWindow();
            if (((byte)lcWidgetWindow::category.field_2.bools.enabledWarning._q_value._M_base._M_i &
                1) != 0) {
              QMessageLogger::warning();
              QVar8.stream = local_70.stream;
              QVar17.m_data = &DAT_0000000b;
              QVar17.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar17);
              QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)local_50);
              if (local_50[0] != (QArrayData *)0x0) {
                LOCK();
                (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_50[0],2,0x10);
                }
              }
              if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_70.stream,' ');
              }
              local_68.stream = local_70.stream;
              *(int *)(local_70.stream + 0x28) = *(int *)(local_70.stream + 0x28) + 1;
              ::operator<<((Stream *)&local_60,(QWindow *)&local_68);
              QVar8.stream = local_60.stream;
              QVar18.m_data = (storage_type *)0x11;
              QVar18.m_size = (qsizetype)local_50;
              QString::fromUtf8(QVar18);
              QTextStream::operator<<((QTextStream *)QVar8.stream,(QString *)local_50);
              if (local_50[0] != (QArrayData *)0x0) {
                LOCK();
                (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_50[0],2,0x10);
                }
              }
              if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_60.stream,' ');
              }
              QTextStream::operator<<((QTextStream *)local_60.stream,this);
              if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
                QTextStream::operator<<((QTextStream *)local_60.stream,' ');
              }
              QDebug::~QDebug(&local_60);
              QDebug::~QDebug(&local_68);
              QDebug::~QDebug(&local_70);
            }
            QWindow::setParent(pQVar14);
          }
          lVar15 = lVar15 + 8;
        } while (lVar13 << 3 != lVar15);
      }
    }
    QWidget::destroy(parent,true,false);
  }
  adjustFlags((WindowFlags *)&local_54,parent);
  (this->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
  super_QFlagsStorage<Qt::WindowType>.i = local_54.i;
  this_00 = *(QWidgetPrivate **)&parent->field_0x8;
  if ((this_00->high_attributes[0] >> 0x1c & 1) != 0) {
    this_00->high_attributes[0] = this_00->high_attributes[0] & 0xefffffff;
  }
  pQVar5 = parent->data;
  if ((short)pQVar5->widget_attributes < 0) {
    pQVar5->widget_attributes = pQVar5->widget_attributes & 0xffff7fff;
  }
  if ((pQVar5->widget_attributes >> 0x10 & 1) != 0) {
    pQVar5->widget_attributes = pQVar5->widget_attributes & 0xfffeffff;
  }
  if (((uVar2 >> 0x1c & 1) != 0 && newparent != (QWidget *)0x0) &&
     ((local_54.i & 1) != 0 || (this_00->high_attributes[2] & 0x10) != 0)) {
    createWinId(this_00);
  }
  pQVar5 = parent->data;
  if ((((newparent == (QWidget *)0x0) ||
       (((pQVar5->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) ||
      ((~bVar9 & (newparent->data->widget_attributes & 0x8000) == 0) == 0)) &&
     ((pQVar5->widget_attributes >> 0x10 & 1) == 0)) {
    pQVar5->widget_attributes = pQVar5->widget_attributes | 0x10000;
  }
  lVar3 = *(long *)&parent->field_0x8;
  if (bVar9 != (byte)((*(uint *)(lVar3 + 0x244) & 0x20) >> 5)) {
    *(uint *)(lVar3 + 0x244) = (uint)bVar9 << 5 | *(uint *)(lVar3 + 0x244) & 0xffffffdf;
  }
  if ((newparent == (QWidget *)0x0) && (pQVar10 != (QScreen *)0x0)) {
    if ((*(byte *)(lVar3 + 0x243) & 0x10) == 0) {
      createTLExtra(this);
      _Var6.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
           (((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
           super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      uVar12 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar10);
      piVar7 = *(int **)((long)_Var6.
                               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                               super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8);
      *(undefined8 *)
       ((long)_Var6.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xb8) = uVar12;
      *(QScreen **)
       ((long)_Var6.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xc0) = pQVar10;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          operator_delete(piVar7);
        }
      }
    }
    else {
      QWindow::setScreen(*(QScreen **)(*(long *)(*(long *)(lVar3 + 0x78) + 8) + 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setParent_sys(QWidget *newparent, Qt::WindowFlags f)
{
    Q_Q(QWidget);

    Qt::WindowFlags oldFlags = data.window_flags;
    bool wasCreated = q->testAttribute(Qt::WA_WState_Created);

    QScreen *targetScreen = nullptr;
    // Handle a request to move the widget to a particular screen
    if (newparent && newparent->windowType() == Qt::Desktop) {
        // make sure the widget is created on the same screen as the
        // programmer specified desktop widget
        targetScreen = newparent->screen();
        newparent = nullptr;
    }

    setWinId(0);

    if (!newparent) {
        f |= Qt::Window;
        if (parent)
            targetScreen = q->parentWidget()->window()->screen();
    }

    const bool destroyWindow = (
        // Reparenting top level to child
        (oldFlags & Qt::Window) && !(f & Qt::Window)
        // And we can dispose of the window
        && wasCreated && !q->testAttribute(Qt::WA_NativeWindow)
    );

    if (parent != newparent) {
        // Update object parent now, so we can resolve new parent window below
        QObjectPrivate::setParent_helper(newparent);

        if (q->windowHandle())
            q->windowHandle()->setFlags(f);

        // If the widget itself or any of its children have been created,
        // we need to reparent their QWindows as well.
        QWidget *parentWithWindow = closestParentWidgetWithWindowHandle();
        // But if the widget is about to be destroyed we must skip the
        // widget itself, and only reparent children.
        if (destroyWindow) {
            reparentWidgetWindowChildren(parentWithWindow);
        } else {
            // During reparentWidgetWindows() we need to know whether the reparented
            // QWindow should be a top level (with a transient parent) or not. This
            // widget has not updated its window flags yet, so we can't ask the widget
            // directly at that point. Nor can we use the QWindow flags, as unlike QWidgets
            // the QWindow flags always reflect Qt::Window, even for child windows. And
            // we can't use QWindow::isTopLevel() either, as that depends on the parent,
            // which we are in the process of updating. So we propagate the
            // new flags of the reparented window here.
            reparentWidgetWindows(parentWithWindow, f);
        }
    }

    bool explicitlyHidden = isExplicitlyHidden();

    if (destroyWindow) {
        if (extra && extra->hasWindowContainer)
            QWindowContainer::toplevelAboutToBeDestroyed(q);

        // There shouldn't be any QWindow children left, but if there
        // are, re-parent them now, before we destroy.
        if (!q->windowHandle()->children().isEmpty()) {
            QWidget *parentWithWindow = closestParentWidgetWithWindowHandle();
            QWindow *newParentWindow = parentWithWindow ? parentWithWindow->windowHandle() : nullptr;
            for (QObject *child : q->windowHandle()->children()) {
                if (QWindow *childWindow = qobject_cast<QWindow *>(child)) {
                    qCWarning(lcWidgetWindow) << "Reparenting" << childWindow
                                              << "before destroying" << this;
                    childWindow->setParent(newParentWindow);
                }
            }
        }

        // We have reparented any child windows of the widget we are
        // about to destroy to the new parent window handle, so we can
        // safely destroy this widget without destroying sub windows.
        q->destroy(true, false);
    }

    adjustFlags(f, q);
    data.window_flags = f;
    q->setAttribute(Qt::WA_WState_Created, false);
    q->setAttribute(Qt::WA_WState_Visible, false);
    q->setAttribute(Qt::WA_WState_Hidden, false);

    if (newparent && wasCreated && (q->testAttribute(Qt::WA_NativeWindow) || (f & Qt::Window)))
        q->createWinId();

    if (q->isWindow() || (!newparent || newparent->isVisible()) || explicitlyHidden)
        q->setAttribute(Qt::WA_WState_Hidden);
    q->setAttribute(Qt::WA_WState_ExplicitShowHide, explicitlyHidden);

    // move the window to the selected screen
    if (!newparent && targetScreen) {
        // only if it is already created
        if (q->testAttribute(Qt::WA_WState_Created))
            q->windowHandle()->setScreen(targetScreen);
        else
            topData()->initialScreen = targetScreen;
    }
}